

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyfit.h
# Opt level: O2

void __thiscall
PolyFit<double>::dataToEigenSubset
          (PolyFit<double> *this,set<int,_std::less<int>,_std::allocator<int>_> *indexSet)

{
  Scalar SVar1;
  Scalar *pSVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  
  lVar4 = (long)(int)(indexSet->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->xM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar4,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->yM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar4,1);
  lVar4 = 0;
  for (p_Var3 = (indexSet->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(indexSet->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    SVar1 = (this->x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[(int)p_Var3[1]._M_color];
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->xM,
                        lVar4,0);
    *pSVar2 = SVar1;
    SVar1 = (this->y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[(int)p_Var3[1]._M_color];
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->yM,
                        lVar4,0);
    *pSVar2 = SVar1;
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

void dataToEigenSubset(std::set<int> &indexSet)
    {
      int nVal = static_cast<int>(indexSet.size());
      xM.resize(nVal,1);
      yM.resize(nVal,1);
      
      int cnt = 0;  
      std::set<int>::iterator it = indexSet.begin();
      while (it != indexSet.end())
      {
        xM(cnt,0) = x[*it];
        yM(cnt,0) = y[*it];
        ++cnt; ++it;
      }
    }